

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-node.h
# Opt level: O1

void __thiscall mp::pre::ValueNode::CleanUpAndRealloc(ValueNode *this)

{
  pointer piVar1;
  pointer pdVar2;
  
  piVar1 = (this->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if ((this->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  pdVar2 = (this->vd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->vd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->vi_,this->sz_);
  std::vector<double,_std::allocator<double>_>::resize(&this->vd_,this->sz_);
  return;
}

Assistant:

void CleanUpAndRealloc() {
    vi_.clear(); vd_.clear();
    vi_.resize(Size()); vd_.resize(Size());
  }